

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

char ** iniparser_getseckeys(dictionary *d,char *s,char **keys)

{
  int iVar1;
  size_t sVar2;
  char local_438 [8];
  char keym [1025];
  int seclen;
  int j;
  int i;
  char **keys_local;
  char *s_local;
  dictionary *d_local;
  
  if ((d == (dictionary *)0x0) || (keys == (char **)0x0)) {
    d_local = (dictionary *)0x0;
  }
  else {
    iVar1 = iniparser_find_entry(d,s);
    if (iVar1 == 0) {
      d_local = (dictionary *)0x0;
    }
    else {
      sVar2 = strlen(s);
      keym._1020_4_ = (undefined4)sVar2;
      sprintf(local_438,"%s:",s);
      seclen = 0;
      for (stack0xffffffffffffffd0 = 0; d_local = (dictionary *)keys,
          (long)stack0xffffffffffffffd0 < d->size; register0x00000000 = stack0xffffffffffffffd0 + 1)
      {
        if ((d->key[stack0xffffffffffffffd0] != (char *)0x0) &&
           (iVar1 = strncmp(d->key[stack0xffffffffffffffd0],local_438,(long)(keym._1020_4_ + 1)),
           iVar1 == 0)) {
          keys[seclen] = d->key[stack0xffffffffffffffd0];
          seclen = seclen + 1;
        }
      }
    }
  }
  return (char **)d_local;
}

Assistant:

const char ** iniparser_getseckeys(const dictionary * d, const char * s, const char ** keys)
{
    int i, j, seclen ;
    char keym[ASCIILINESZ+1];

    if (d==NULL || keys==NULL) return NULL;
    if (! iniparser_find_entry(d, s)) return NULL;

    seclen  = (int)strlen(s);
    sprintf(keym, "%s:", s);

    i = 0;

    for (j=0 ; j<d->size ; j++) {
        if (d->key[j]==NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen+1)) {
            keys[i] = d->key[j];
            i++;
        }
    }

    return keys;
}